

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sift.cc
# Opt level: O0

void __thiscall features::Sift::set_image(Sift *this,ConstPtr *img)

{
  int iVar1;
  ImageBase *pIVar2;
  invalid_argument *this_00;
  shared_ptr<const_core::Image<float>_> local_68;
  shared_ptr<core::Image<float>_> local_58;
  shared_ptr<const_core::Image<unsigned_char>_> local_48;
  shared_ptr<core::Image<float>_> local_38 [2];
  ConstPtr *local_18;
  ConstPtr *img_local;
  Sift *this_local;
  
  local_18 = img;
  img_local = (ConstPtr *)this;
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)img);
  iVar1 = core::ImageBase::channels(pIVar2);
  if (iVar1 != 1) {
    pIVar2 = (ImageBase *)
             std::
             __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)img);
    iVar1 = core::ImageBase::channels(pIVar2);
    if (iVar1 != 3) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Gray or color image expected");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
  }
  std::shared_ptr<const_core::Image<unsigned_char>_>::shared_ptr(&local_48,img);
  core::image::byte_to_float_image((image *)local_38,&local_48);
  std::shared_ptr<core::Image<float>const>::operator=
            ((shared_ptr<core::Image<float>const> *)&this->orig,local_38);
  std::shared_ptr<core::Image<float>_>::~shared_ptr(local_38);
  std::shared_ptr<const_core::Image<unsigned_char>_>::~shared_ptr(&local_48);
  pIVar2 = (ImageBase *)
           std::
           __shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<const_core::Image<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)img);
  iVar1 = core::ImageBase::channels(pIVar2);
  if (iVar1 == 3) {
    std::shared_ptr<const_core::Image<float>_>::shared_ptr(&local_68,&this->orig);
    core::image::desaturate<float>((image *)&local_58,&local_68,DESATURATE_AVERAGE);
    std::shared_ptr<core::Image<float>const>::operator=
              ((shared_ptr<core::Image<float>const> *)&this->orig,&local_58);
    std::shared_ptr<core::Image<float>_>::~shared_ptr(&local_58);
    std::shared_ptr<const_core::Image<float>_>::~shared_ptr(&local_68);
  }
  return;
}

Assistant:

void
Sift::set_image (core::ByteImage::ConstPtr img)
{
    if (img->channels() != 1 && img->channels() != 3)
        throw std::invalid_argument("Gray or color image expected");

    // 将图像转化成灰度图
    this->orig = core::image::byte_to_float_image(img);
    if (img->channels() == 3) {
        this->orig = core::image::desaturate<float>
            (this->orig, core::image::DESATURATE_AVERAGE);
    }
}